

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table-utils.cpp
# Opt level: O2

bool wasm::TableUtils::usesExpressions(ElementSegment *curr,Module *module)

{
  pointer ppEVar1;
  uintptr_t in_RAX;
  pointer ppEVar2;
  long lVar3;
  long lVar4;
  pointer ppEVar5;
  Type local_28;
  
  ppEVar2 = (curr->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppEVar1 = (curr->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)ppEVar1 - (long)ppEVar2;
  for (lVar4 = lVar3 >> 5; 0 < lVar4; lVar4 = lVar4 + -1) {
    ppEVar5 = ppEVar2;
    if ((*ppEVar2)->_id != RefFuncId) goto LAB_00911996;
    if (ppEVar2[1]->_id != RefFuncId) {
      ppEVar5 = ppEVar2 + 1;
      goto LAB_00911996;
    }
    if (ppEVar2[2]->_id != RefFuncId) {
      ppEVar5 = ppEVar2 + 2;
      goto LAB_00911996;
    }
    if (ppEVar2[3]->_id != RefFuncId) {
      ppEVar5 = ppEVar2 + 3;
      goto LAB_00911996;
    }
    ppEVar2 = ppEVar2 + 4;
    lVar3 = lVar3 + -0x20;
  }
  lVar3 = lVar3 >> 3;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      ppEVar5 = ppEVar1;
      if ((lVar3 != 3) || (ppEVar5 = ppEVar2, (*ppEVar2)->_id != RefFuncId)) goto LAB_00911996;
      ppEVar2 = ppEVar2 + 1;
    }
    ppEVar5 = ppEVar2;
    if ((*ppEVar2)->_id != RefFuncId) goto LAB_00911996;
    ppEVar2 = ppEVar2 + 1;
  }
  ppEVar5 = ppEVar2;
  if ((*ppEVar2)->_id == RefFuncId) {
    ppEVar5 = ppEVar1;
  }
LAB_00911996:
  local_28.id = in_RAX;
  wasm::Type::Type(&local_28,(HeapType)0x10,Nullable,Inexact);
  return (curr->type).id != local_28.id || ppEVar5 != ppEVar1;
}

Assistant:

bool usesExpressions(ElementSegment* curr, Module* module) {
  // Binaryen IR always has ref.funcs for functions in tables for uniformity,
  // so that by itself does not indicate if expressions should be used when
  // emitting the table or not. But definitely anything that is not a ref.func
  // implies we are post-MVP and must use expressions.
  bool allElementsRefFunc =
    std::all_of(curr->data.begin(), curr->data.end(), [](Expression* entry) {
      return entry->is<RefFunc>();
    });

  // If the segment has a specialized (non-MVP) type, then it must use the
  // post-MVP form of using expressions.
  bool hasSpecializedType = curr->type != Type(HeapType::func, Nullable);

  return !allElementsRefFunc || hasSpecializedType;
}